

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseRenderingCase::drawPrimitives
          (BaseRenderingCase *this,Surface *result,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colorData,
          GLenum primitiveType)

{
  code *pcVar1;
  undefined4 uVar2;
  GLint GVar3;
  GLenum GVar4;
  int iVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  const_reference pvVar8;
  size_type sVar9;
  PixelBufferAccess local_70;
  undefined4 local_44;
  undefined4 local_40;
  GLint pointSizeLoc;
  GLint colorLoc;
  GLint positionLoc;
  Functions *gl;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvStack_28;
  GLenum primitiveType_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colorData_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData_local;
  Surface *result_local;
  BaseRenderingCase *this_local;
  
  gl._4_4_ = primitiveType;
  pvStack_28 = colorData;
  colorData_local = vertexData;
  vertexData_local =
       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)result;
  result_local = (Surface *)this;
  pRVar7 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar7->_vptr_RenderContext[3])();
  _colorLoc = CONCAT44(extraout_var,iVar5);
  pcVar1 = *(code **)(_colorLoc + 0x780);
  dVar6 = glu::ShaderProgram::getProgram(this->m_shader);
  pointSizeLoc = (*pcVar1)(dVar6,"a_position");
  pcVar1 = *(code **)(_colorLoc + 0x780);
  dVar6 = glu::ShaderProgram::getProgram(this->m_shader);
  local_40 = (*pcVar1)(dVar6,"a_color");
  pcVar1 = *(code **)(_colorLoc + 0xb48);
  dVar6 = glu::ShaderProgram::getProgram(this->m_shader);
  local_44 = (*pcVar1)(dVar6,"u_pointSize");
  (**(code **)(_colorLoc + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(_colorLoc + 0x188))(0x4000);
  (**(code **)(_colorLoc + 0x1a00))(0,0,this->m_renderSize,this->m_renderSize);
  pcVar1 = *(code **)(_colorLoc + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram(this->m_shader);
  (*pcVar1)(dVar6);
  (**(code **)(_colorLoc + 0x610))(pointSizeLoc);
  GVar3 = pointSizeLoc;
  pcVar1 = *(code **)(_colorLoc + 0x19f0);
  pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (colorData_local,0);
  (*pcVar1)(GVar3,4,0x1406,0,0,pvVar8);
  (**(code **)(_colorLoc + 0x610))(local_40);
  uVar2 = local_40;
  pcVar1 = *(code **)(_colorLoc + 0x19f0);
  pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (pvStack_28,0);
  (*pcVar1)(uVar2,4,0x1406,0,0,pvVar8);
  (**(code **)(_colorLoc + 0x14e0))(this->m_pointSize,local_44);
  (**(code **)(_colorLoc + 0xce0))(this->m_lineWidth);
  GVar4 = gl._4_4_;
  pcVar1 = *(code **)(_colorLoc + 0x538);
  sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    (colorData_local);
  (*pcVar1)(GVar4,0,sVar9 & 0xffffffff);
  (**(code **)(_colorLoc + 0x518))(local_40);
  (**(code **)(_colorLoc + 0x518))(pointSizeLoc);
  (**(code **)(_colorLoc + 0x1680))(0);
  (**(code **)(_colorLoc + 0x648))();
  dVar6 = (**(code **)(_colorLoc + 0x800))();
  glu::checkError(dVar6,"draw primitives",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fRasterizationTests.cpp"
                  ,0xd8);
  pRVar7 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_70,(Surface *)vertexData_local);
  glu::readPixels(pRVar7,0,0,&local_70);
  return;
}

Assistant:

void BaseRenderingCase::drawPrimitives (tcu::Surface& result, const std::vector<tcu::Vec4>& vertexData, const std::vector<tcu::Vec4>& colorData, glw::GLenum primitiveType)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const glw::GLint		positionLoc		= gl.getAttribLocation(m_shader->getProgram(), "a_position");
	const glw::GLint		colorLoc		= gl.getAttribLocation(m_shader->getProgram(), "a_color");
	const glw::GLint		pointSizeLoc	= gl.getUniformLocation(m_shader->getProgram(), "u_pointSize");

	gl.clearColor					(0, 0, 0, 1);
	gl.clear						(GL_COLOR_BUFFER_BIT);
	gl.viewport						(0, 0, m_renderSize, m_renderSize);
	gl.useProgram					(m_shader->getProgram());
	gl.enableVertexAttribArray		(positionLoc);
	gl.vertexAttribPointer			(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &vertexData[0]);
	gl.enableVertexAttribArray		(colorLoc);
	gl.vertexAttribPointer			(colorLoc, 4, GL_FLOAT, GL_FALSE, 0, &colorData[0]);
	gl.uniform1f					(pointSizeLoc, m_pointSize);
	gl.lineWidth					(m_lineWidth);
	gl.drawArrays					(primitiveType, 0, (glw::GLsizei)vertexData.size());
	gl.disableVertexAttribArray		(colorLoc);
	gl.disableVertexAttribArray		(positionLoc);
	gl.useProgram					(0);
	gl.finish						();
	GLU_EXPECT_NO_ERROR				(gl.getError(), "draw primitives");

	glu::readPixels(m_context.getRenderContext(), 0, 0, result.getAccess());
}